

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::lower(QWidget *this)

{
  QWidgetPrivate *this_00;
  long lVar1;
  QWExtra *pQVar2;
  qsizetype qVar3;
  QWidgetPrivate *pQVar4;
  int iVar5;
  long in_FS_OFFSET;
  QWidget *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  pQVar4 = this_00;
  if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
    lVar1 = *(long *)&this_00->field_0x10;
    if (*(int *)(*(long *)(lVar1 + 8) + 0x28) < 2) goto LAB_0030225c;
    local_38 = this;
    qVar3 = QtPrivate::indexOf<QObject*,QWidget*>
                      ((QList<QObject_*> *)(*(long *)(lVar1 + 8) + 0x18),&local_38,0);
    iVar5 = (int)qVar3;
    if (iVar5 != 0) {
      QList<QObject_*>::move((QList<QObject_*> *)(*(long *)(lVar1 + 8) + 0x18),(long)iVar5,0);
    }
    pQVar4 = *(QWidgetPrivate **)&this->field_0x8;
    if (((pQVar4->high_attributes[0] & 0x10000000) == 0) &&
       ((*(byte *)(*(long *)(lVar1 + 8) + 0x243) & 0x10) != 0)) {
      create(this,0,false,false);
      pQVar4 = *(QWidgetPrivate **)&this->field_0x8;
    }
    else if (iVar5 == 0) goto LAB_0030225c;
  }
  if ((pQVar4->high_attributes[0] & 0x10000000) != 0) {
    QWidgetPrivate::lower_sys(this_00);
  }
  pQVar2 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if ((pQVar2 != (QWExtra *)0x0) && ((pQVar2->field_0x7d & 1) != 0)) {
    QWindowContainer::parentWasLowered(this);
  }
  local_38 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_38,ZOrderChange);
  QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_38);
  QEvent::~QEvent((QEvent *)&local_38);
LAB_0030225c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::lower()
{
    Q_D(QWidget);
    if (!isWindow()) {
        QWidget *p = parentWidget();
        const int parentChildCount = p->d_func()->children.size();
        if (parentChildCount < 2)
            return;
        const int from = p->d_func()->children.indexOf(this);
        Q_ASSERT(from >= 0);
        // Do nothing if the widget is already in correct stacking order _and_ created.
        if (from != 0)
            p->d_func()->children.move(from, 0);
        if (!testAttribute(Qt::WA_WState_Created) && p->testAttribute(Qt::WA_WState_Created))
            create();
        else if (from == 0)
            return;
    }
    if (testAttribute(Qt::WA_WState_Created))
        d->lower_sys();

    if (d->extra && d->extra->hasWindowContainer)
        QWindowContainer::parentWasLowered(this);

    QEvent e(QEvent::ZOrderChange);
    QCoreApplication::sendEvent(this, &e);
}